

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmsplt(mcmcx1def *ctx,mcmon n,ushort siz)

{
  uchar *puVar1;
  mcmodef *pmVar2;
  mcmodef *pmVar3;
  size_t sVar4;
  ushort in_DX;
  ushort in_SI;
  mcmcx1def *in_RDI;
  mcmodef *newp;
  mcmon newn;
  mcmodef *o;
  short sVar5;
  mcmon *in_stack_ffffffffffffffd0;
  mcmcx1def *in_stack_ffffffffffffffd8;
  mcmon local_1a;
  
  pmVar2 = in_RDI->mcmcxtab[(int)(uint)in_SI >> 8] + (int)(in_SI & 0xff);
  if ((in_DX + 0x40 <= (uint)pmVar2->mcmosiz) &&
     (pmVar3 = mcmoal(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), local_1a != 0xffff)) {
    *(mcmon *)(pmVar2->mcmoptr + (int)(uint)in_DX) = local_1a;
    puVar1 = pmVar2->mcmoptr;
    sVar4 = osrndsz(2);
    pmVar3->mcmoptr = puVar1 + sVar4 + (long)(int)(uint)in_DX;
    sVar5 = pmVar2->mcmosiz - in_DX;
    sVar4 = osrndsz(2);
    pmVar3->mcmosiz = sVar5 - (short)sVar4;
    pmVar3->mcmoflg = 0x80;
    mcmlnkhd(in_RDI,&in_RDI->mcmcxfre,local_1a);
    pmVar2->mcmosiz = in_DX;
  }
  return;
}

Assistant:

static void mcmsplt(mcmcx1def *ctx, mcmon n, ushort siz)
{
    mcmodef *o = mcmgobje(ctx, n);
    mcmon    newn;
    mcmodef *newp;
    
    MCMGLBCTX(ctx);

    if (o->mcmosiz < siz + MCMSPLIT) return;     /* don't split; we're done */

    newp = mcmoal(ctx, &newn);
    if (newn == MCMONINV) return;         /* ignore error - just skip split */

    /* set up the new entry, and link into free list */
    *(mcmon *)(o->mcmoptr + siz) = newn;
    newp->mcmoptr = o->mcmoptr + siz + osrndsz(sizeof(mcmon));
    newp->mcmosiz = o->mcmosiz - siz - osrndsz(sizeof(mcmon));
    newp->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, newn);
    
    o->mcmosiz = siz;       /* size of new object is now exactly as request */
}